

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateCoTest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  bool bVar1;
  type_conflict5 tVar2;
  IdxSet *this_00;
  char *pcVar3;
  int *piVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Status stat;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pricingTol;
  Desc *ds;
  IdxSet *idx;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffc78;
  int n;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc80;
  type_conflict5 local_369;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  undefined1 local_2dc [164];
  Status in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffdd0;
  undefined1 local_1dc [128];
  Status local_15c;
  int local_158;
  uint local_154;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff10;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_89;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  undefined1 *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_59;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::delta(in_RDI->theCoPvec);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(in_stack_ffffffffffffff10);
  this_00 = UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::idx((UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x6b3331);
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::desc(&in_RDI->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        );
  leavetol(in_RDI);
  IdxSet::clear(&(in_RDI->updateViols).super_IdxSet);
  local_154 = IdxSet::size(this_00);
  uVar5 = extraout_RDX;
  while (local_154 = local_154 - 1, -1 < (int)local_154) {
    pcVar3 = IdxSet::index(this_00,(char *)(ulong)local_154,(int)uVar5);
    local_158 = (int)pcVar3;
    local_15c = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::Desc::coStatus((Desc *)in_stack_fffffffffffffc80,
                                 (int)((ulong)in_stack_fffffffffffffc78 >> 0x20));
    bVar1 = isBasic(in_stack_fffffffffffffc80,(Status)((ulong)in_stack_fffffffffffffc78 >> 0x20));
    if (bVar1) {
      piVar4 = DataArray<int>::operator[](&in_RDI->isInfeasible,local_158);
      *piVar4 = 0;
      in_stack_fffffffffffffca0 = 0;
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20));
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffc80,
                 (long_long_type)in_stack_fffffffffffffc78);
      uVar5 = extraout_RDX_06;
    }
    else {
      local_369 = false;
      if ((in_RDI->m_pricingViolUpToDate & 1U) != 0) {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20));
        local_20 = local_1dc;
        local_28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&stack0xfffffffffffffeb0;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_29,local_28);
        local_10 = local_1dc;
        local_18 = local_28;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffc80,
                   in_stack_fffffffffffffc78);
        local_8 = local_1dc;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffc80);
        local_369 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_fffffffffffffc78,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x6b34b7);
      }
      if (local_369 != false) {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20));
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator+=((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                     (self_type *)in_RDI);
      }
      coTest(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20));
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffc80,
                 in_stack_fffffffffffffc78);
      n = (int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
      if ((in_RDI->sparsePricingEnter & 1U) == 0) {
        in_stack_fffffffffffffc78 =
             &VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_fffffffffffffc80,n)->m_backend;
        local_80 = &stack0xfffffffffffffca4;
        local_88 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&stack0xfffffffffffffeb0;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_89,local_88);
        local_70 = &stack0xfffffffffffffca4;
        local_78 = local_88;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffc80,
                   in_stack_fffffffffffffc78);
        local_68 = &stack0xfffffffffffffca4;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffc80);
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffffc78,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x6b3799);
        uVar5 = extraout_RDX_04;
        if (tVar2) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20))
          ;
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator-=((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                       (self_type *)in_RDI);
          uVar5 = extraout_RDX_05;
        }
      }
      else {
        in_stack_fffffffffffffc80 =
             (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_fffffffffffffc80,n);
        local_50 = local_2dc;
        local_58 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&stack0xfffffffffffffeb0;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_59,local_58);
        local_40 = local_2dc;
        local_48 = local_58;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffc80,
                   in_stack_fffffffffffffc78);
        local_38 = local_2dc;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffc80);
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffffc78,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x6b361e);
        if (tVar2) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20))
          ;
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator-=((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                       (self_type *)in_RDI);
          piVar4 = DataArray<int>::operator[](&in_RDI->isInfeasible,local_158);
          uVar5 = extraout_RDX_00;
          if (*piVar4 == 0) {
            DIdxSet::addIdx((DIdxSet *)in_stack_fffffffffffffc80,
                            (int)((ulong)in_stack_fffffffffffffc78 >> 0x20));
            piVar4 = DataArray<int>::operator[](&in_RDI->isInfeasible,local_158);
            *piVar4 = 1;
            uVar5 = extraout_RDX_01;
          }
          if ((in_RDI->hyperPricingEnter & 1U) != 0) {
            DIdxSet::addIdx((DIdxSet *)in_stack_fffffffffffffc80,
                            (int)((ulong)in_stack_fffffffffffffc78 >> 0x20));
            uVar5 = extraout_RDX_02;
          }
        }
        else {
          piVar4 = DataArray<int>::operator[](&in_RDI->isInfeasible,local_158);
          *piVar4 = 0;
          uVar5 = extraout_RDX_03;
        }
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::updateCoTest()
{
   theCoPvec->delta().setup();

   const IdxSet& idx = theCoPvec->idx();
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   R pricingTol = leavetol();

   int i;
   updateViols.clear();

   for(i = idx.size() - 1; i >= 0; --i)
   {
      int j = idx.index(i);
      typename SPxBasisBase<R>::Desc::Status stat = ds.coStatus(j);

      if(!isBasic(stat))
      {
         if(m_pricingViolUpToDate && theCoTest[j] < -pricingTol)
            m_pricingViol += theCoTest[j];

         theCoTest[j] = coTest(j, stat);

         if(sparsePricingEnter)
         {
            if(theCoTest[j] < -pricingTol)
            {
               assert(remainingRoundsEnter == 0);
               m_pricingViol -= theCoTest[j];

               if(isInfeasible[j] == SPxPricer<R>::NOT_VIOLATED)
               {
                  //                if( !hyperPricingEnter )
                  infeasibilities.addIdx(j);
                  isInfeasible[j] = SPxPricer<R>::VIOLATED;
               }

               if(hyperPricingEnter)
                  updateViols.addIdx(j);
            }
            else
            {
               // @todo do we need to remove index j from infeasibilitiesCo?
               isInfeasible[j] = SPxPricer<R>::NOT_VIOLATED;
            }
         }
         else if(theCoTest[j] < -pricingTol)
            m_pricingViol -= theCoTest[j];
      }
      else
      {
         isInfeasible[j] = SPxPricer<R>::NOT_VIOLATED;
         theCoTest[j] = 0;
      }
   }
}